

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_sequence_item_prolog(fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_value)

{
  _Bool _Var1;
  int local_24;
  int tmp_indent;
  fy_token *fyt_value_local;
  fy_emit_save_ctx *sc_local;
  fy_emitter *emit_local;
  
  sc->flags = sc->flags | 2;
  _Var1 = fy_emit_is_oneline(emit);
  if (!_Var1) {
    fy_emit_write_indent(emit,sc->indent);
  }
  if (((*(byte *)sc >> 1 & 1) == 0) && (_Var1 = fy_emit_is_json_mode(emit), !_Var1)) {
    fy_emit_write_indicator(emit,di_dash,sc->flags,sc->indent,fyewt_indicator);
  }
  local_24 = sc->indent;
  _Var1 = fy_emit_token_has_comment(emit,fyt_value,fycp_top);
  if (_Var1) {
    if (((*(byte *)sc >> 1 & 1) == 0) && (_Var1 = fy_emit_is_json_mode(emit), !_Var1)) {
      local_24 = fy_emit_increase_indent(emit,sc->flags,sc->indent);
    }
    fy_emit_token_comment(emit,fyt_value,sc->flags,local_24,fycp_top);
  }
  return;
}

Assistant:

static void fy_emit_sequence_item_prolog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                         struct fy_token *fyt_value) {
    int tmp_indent;

    sc->flags |= DDNF_SEQ;

    if (!fy_emit_is_oneline(emit))
        fy_emit_write_indent(emit, sc->indent);

    if (!sc->flow && !fy_emit_is_json_mode(emit))
        fy_emit_write_indicator(emit, di_dash, sc->flags, sc->indent, fyewt_indicator);

    tmp_indent = sc->indent;
    if (fy_emit_token_has_comment(emit, fyt_value, fycp_top)) {
        if (!sc->flow && !fy_emit_is_json_mode(emit))
            tmp_indent = fy_emit_increase_indent(emit, sc->flags, sc->indent);
        fy_emit_token_comment(emit, fyt_value, sc->flags, tmp_indent, fycp_top);
    }
}